

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O0

void anon_unknown.dwarf_41e4::test_iterator_read(void **param_1)

{
  roaring64_iterator_t *it_00;
  size_type count;
  roaring64_iterator_t *file;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this;
  uint64_t b;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buf_2;
  roaring64_iterator_t *it_2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> buf_1;
  roaring64_iterator_t *it_1;
  uint64_t buf [1];
  roaring64_iterator_t *it;
  uint64_t v;
  uint64_t i;
  roaring64_bulk_context_t context;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  roaring64_bitmap_t *r;
  int in_stack_fffffffffffffe9c;
  roaring64_bitmap_t *in_stack_fffffffffffffea0;
  allocator_type *in_stack_fffffffffffffea8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffeb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *rhs;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffec0;
  roaring64_iterator_t *this_00;
  roaring64_bulk_context_t *in_stack_fffffffffffffec8;
  roaring64_bitmap_t *in_stack_fffffffffffffed0;
  uint64_t in_stack_fffffffffffffed8;
  uint64_t *in_stack_fffffffffffffee0;
  uint64_t *buf_00;
  roaring64_iterator_t *in_stack_fffffffffffffee8;
  roaring64_bitmap_t *r_00;
  uint64_t in_stack_ffffffffffffff40;
  roaring64_bitmap_t *in_stack_ffffffffffffff48;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff50;
  undefined1 local_91 [33];
  roaring64_iterator_t *local_70;
  roaring64_iterator_t *local_60;
  long local_58;
  ulong local_50;
  undefined1 local_48 [32];
  roaring64_bitmap_t *local_10;
  
  local_10 = roaring64_bitmap_create();
  r_00 = (roaring64_bitmap_t *)&stack0xffffffffffffffd8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x1096a1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffed0,
             (size_type)in_stack_fffffffffffffec8);
  memset(local_48,0,0x10);
  for (local_50 = 0; local_50 < 1000; local_50 = local_50 + 1) {
    local_58 = local_50 * 10000;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_stack_fffffffffffffeb0,(value_type *)in_stack_fffffffffffffea8);
    roaring64_bitmap_add_bulk
              (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
               (uint64_t)in_stack_fffffffffffffec0);
  }
  local_60 = roaring64_iterator_create(in_stack_fffffffffffffea0);
  roaring64_iterator_read
            (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  _assert_int_equal((unsigned_long)in_stack_fffffffffffffeb0,
                    (unsigned_long)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                    in_stack_fffffffffffffe9c);
  roaring64_iterator_free((roaring64_iterator_t *)0x1097d7);
  readCompare(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  readCompare(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8);
  readCompare(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8);
  readCompare(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffffd8);
  readCompare(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  it_00 = roaring64_iterator_create(in_stack_fffffffffffffea0);
  local_70 = it_00;
  count = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                     &stack0xffffffffffffffd8);
  local_91._1_8_ = 0;
  buf_00 = (uint64_t *)local_91;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x109907);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffec0,(size_type)in_stack_fffffffffffffeb8,
             (value_type *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x109935);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10994f);
  roaring64_iterator_read(it_00,buf_00,count);
  _assert_int_equal((unsigned_long)in_stack_fffffffffffffeb0,
                    (unsigned_long)in_stack_fffffffffffffea8,(char *)in_stack_fffffffffffffea0,
                    in_stack_fffffffffffffe9c);
  assert_vector_equal(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  roaring64_iterator_free((roaring64_iterator_t *)0x1099ab);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(in_stack_fffffffffffffeb0);
  file = roaring64_iterator_create(in_stack_fffffffffffffea0);
  this_00 = file;
  this = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    &stack0xffffffffffffffd8);
  rhs = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&stack0xffffffffffffff3f;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x109a0b);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,(size_type)rhs,
             (value_type *)this,in_stack_fffffffffffffea8);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x109a39);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x109a53);
  b = roaring64_iterator_read(it_00,buf_00,count);
  _assert_int_equal((unsigned_long)this,b,(char *)file,in_stack_fffffffffffffe9c);
  assert_vector_equal((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00,rhs);
  roaring64_iterator_free((roaring64_iterator_t *)0x109ab2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  roaring64_bitmap_free(r_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(this);
  return;
}

Assistant:

DEFINE_TEST(test_iterator_read) {
    roaring64_bitmap_t* r = roaring64_bitmap_create();
    std::vector<uint64_t> values;
    values.reserve(1000);
    roaring64_bulk_context_t context{};
    for (uint64_t i = 0; i < 1000; ++i) {
        uint64_t v = i * 10000;
        values.push_back(v);
        roaring64_bitmap_add_bulk(r, &context, v);
    }

    {
        // Check that a zero count results in zero elements read.
        roaring64_iterator_t* it = roaring64_iterator_create(r);
        uint64_t buf[1];
        assert_int_equal(roaring64_iterator_read(it, buf, 0), 0);
        roaring64_iterator_free(it);
    }

    readCompare(values, r, 1);
    readCompare(values, r, 2);
    readCompare(values, r, values.size() - 1);
    readCompare(values, r, values.size());
    readCompare(values, r, values.size() + 1);

    {
        // A count of UINT64_MAX.
        roaring64_iterator_t* it = roaring64_iterator_create(r);
        std::vector<uint64_t> buf(values.size(), 0);
        assert_int_equal(roaring64_iterator_read(it, buf.data(), UINT64_MAX),
                         1000);
        assert_vector_equal(buf, values);
        roaring64_iterator_free(it);
    }
    {
        // A count that becomes zero if cast to uint32.
        roaring64_iterator_t* it = roaring64_iterator_create(r);
        std::vector<uint64_t> buf(values.size(), 0);
        assert_int_equal(
            roaring64_iterator_read(it, buf.data(), 0xFFFFFFFF00000000), 1000);
        assert_vector_equal(buf, values);
        roaring64_iterator_free(it);
    }

    roaring64_bitmap_free(r);
}